

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O3

bool __thiscall Table::equals(Table *this,Table b)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  Table *pTVar5;
  bool bVar6;
  
  pTVar5 = &b;
  uVar3 = 0;
  bVar6 = false;
  do {
    lVar4 = 0;
    do {
      cVar1 = Cell::getNumber(this->table[0] + lVar4);
      cVar2 = Cell::getNumber(pTVar5->table[0] + lVar4);
      if (cVar1 != cVar2) {
        return bVar6;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    bVar6 = 1 < uVar3;
    uVar3 = uVar3 + 1;
    this = (Table *)(this->table + 1);
    pTVar5 = (Table *)(pTVar5->table + 1);
  } while (uVar3 != 3);
  return true;
}

Assistant:

bool Table::equals(Table b) {
    for (int i = 0; i < HEIGHT; i++){
        for (int j = 0; j < WIDTH; j++) {
            if (this->table[i][j].getNumber() != b.table[i][j].getNumber()) {
                return false;
            }
        }
    }
    return true;
}